

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void str_utf8_stats(char *str,int max_size,int max_count,int *size,int *count)

{
  int cursor;
  int iVar1;
  
  *size = 0;
  iVar1 = 0;
  while( true ) {
    *count = iVar1;
    cursor = *size;
    if ((max_size <= cursor) || (max_count <= iVar1)) {
      return;
    }
    iVar1 = str_utf8_forward(str,cursor);
    if (iVar1 == cursor) {
      return;
    }
    if (max_size <= iVar1) break;
    *size = iVar1;
    iVar1 = *count + 1;
  }
  return;
}

Assistant:

void str_utf8_stats(const char *str, int max_size, int max_count, int *size, int *count)
{
	*size = 0;
	*count = 0;
	while(*size < max_size && *count < max_count)
	{
		int new_size = str_utf8_forward(str, *size);
		if(new_size == *size || new_size >= max_size)
			break;
		*size = new_size;
		++(*count);
	}
}